

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

bool google::protobuf::compiler::js::anon_unknown_0::HasMap
               (GeneratorOptions *options,Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *field;
  Descriptor *desc_00;
  int local_28;
  int local_24;
  int i_1;
  int i;
  Descriptor *desc_local;
  GeneratorOptions *options_local;
  
  local_24 = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(desc);
    if (iVar2 <= local_24) {
      local_28 = 0;
      while( true ) {
        iVar2 = Descriptor::nested_type_count(desc);
        if (iVar2 <= local_28) {
          return false;
        }
        desc_00 = Descriptor::nested_type(desc,local_28);
        bVar1 = HasMap(options,desc_00);
        if (bVar1) break;
        local_28 = local_28 + 1;
      }
      return true;
    }
    field = Descriptor::field(desc,local_24);
    bVar1 = IsMap(options,field);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool HasMap(const GeneratorOptions& options, const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); i++) {
    if (IsMap(options, desc->field(i))) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); i++) {
    if (HasMap(options, desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}